

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::_copy_hierarchy(Tree *this,size_t dst_,size_t src_)

{
  NodeData *pNVar1;
  NodeData *pNVar2;
  ulong uVar3;
  NodeData *pNVar4;
  code *pcVar5;
  size_t sVar6;
  bool bVar7;
  ulong uVar8;
  
  if ((src_ == 0xffffffffffffffff) || (this->m_cap <= src_)) {
    if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar1 = this->m_buf;
  if ((dst_ == 0xffffffffffffffff) || (this->m_cap <= dst_)) {
    if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar2 = this->m_buf;
  uVar3 = pNVar1[src_].m_parent;
  if ((uVar3 == 0xffffffffffffffff) || (this->m_cap <= uVar3)) {
    if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar4 = this->m_buf;
  for (uVar8 = pNVar1[src_].m_first_child; uVar8 != 0xffffffffffffffff;
      uVar8 = next_sibling(this,uVar8)) {
    if (this->m_cap <= uVar8) {
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this->m_buf[uVar8].m_parent = dst_;
  }
  uVar8 = pNVar1[src_].m_prev_sibling;
  if (uVar8 != 0xffffffffffffffff) {
    if (this->m_cap <= uVar8) {
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this->m_buf[uVar8].m_next_sibling = dst_;
  }
  uVar8 = pNVar1[src_].m_next_sibling;
  if (uVar8 != 0xffffffffffffffff) {
    if (this->m_cap <= uVar8) {
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this->m_buf[uVar8].m_prev_sibling = dst_;
  }
  if (pNVar4[uVar3].m_first_child == src_) {
    pNVar4[uVar3].m_first_child = dst_;
  }
  if (pNVar4[uVar3].m_last_child == src_) {
    pNVar4[uVar3].m_last_child = dst_;
  }
  sVar6 = pNVar1[src_].m_first_child;
  pNVar2[dst_].m_parent = pNVar1[src_].m_parent;
  (&pNVar2[dst_].m_parent)[1] = sVar6;
  pNVar2[dst_].m_prev_sibling = pNVar1[src_].m_prev_sibling;
  sVar6 = pNVar1[src_].m_next_sibling;
  pNVar2[dst_].m_last_child = pNVar1[src_].m_last_child;
  (&pNVar2[dst_].m_last_child)[1] = sVar6;
  return;
}

Assistant:

void Tree::_copy_hierarchy(size_t dst_, size_t src_)
{
    auto const& C4_RESTRICT src = *_p(src_);
    auto      & C4_RESTRICT dst = *_p(dst_);
    auto      & C4_RESTRICT prt = *_p(src.m_parent);
    for(size_t i = src.m_first_child; i != NONE; i = next_sibling(i))
    {
        _p(i)->m_parent = dst_;
    }
    if(src.m_prev_sibling != NONE)
    {
        _p(src.m_prev_sibling)->m_next_sibling = dst_;
    }
    if(src.m_next_sibling != NONE)
    {
        _p(src.m_next_sibling)->m_prev_sibling = dst_;
    }
    if(prt.m_first_child == src_)
    {
        prt.m_first_child = dst_;
    }
    if(prt.m_last_child  == src_)
    {
        prt.m_last_child  = dst_;
    }
    dst.m_parent       = src.m_parent;
    dst.m_first_child  = src.m_first_child;
    dst.m_last_child   = src.m_last_child;
    dst.m_prev_sibling = src.m_prev_sibling;
    dst.m_next_sibling = src.m_next_sibling;
}